

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixtree.hpp
# Opt level: O1

void __thiscall RadixTree::insert(RadixTree *this,uint64_t vadd,uint64_t padd)

{
  value_type *__val;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
  *pvVar1;
  pointer __s;
  undefined8 *puVar2;
  void *pvVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = (uint)vadd & 0x1ff;
  if ((this->t_).
      super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar5] ==
      (vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
       *)0x0) {
    pvVar1 = (vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
              *)operator_new(0x18);
    *(undefined8 *)
     &(pvVar1->
      super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
      )._M_impl = 0;
    *(pointer *)
     ((long)&(pvVar1->
             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
             )._M_impl + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(pvVar1->
             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
             )._M_impl + 0x10) = (pointer)0x0;
    __s = (pointer)operator_new(0x1000);
    *(pointer *)
     &(pvVar1->
      super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
      )._M_impl = __s;
    *(pointer *)
     ((long)&(pvVar1->
             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
             )._M_impl + 8) = __s;
    *(pointer *)
     ((long)&(pvVar1->
             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
             )._M_impl + 0x10) = __s + 0x200;
    memset(__s,0,0x1000);
    *(pointer *)
     ((long)&(pvVar1->
             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
             )._M_impl + 8) = __s + 0x200;
    (this->t_).
    super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar5] = pvVar1;
  }
  if (*(long *)(**(long **)((long)(this->t_).
                                  super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (ulong)(uVar5 * 8)) +
               (ulong)(uVar5 * 8)) == 0) {
    puVar2 = (undefined8 *)operator_new(0x18);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    pvVar3 = operator_new(0x1000);
    *puVar2 = pvVar3;
    puVar2[1] = pvVar3;
    puVar2[2] = (long)pvVar3 + 0x1000;
    memset(pvVar3,0,0x1000);
    puVar2[1] = (long)pvVar3 + 0x1000;
    *(undefined8 **)
     (**(long **)((long)(this->t_).
                        super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start + (ulong)(uVar5 * 8)) +
     (ulong)(uVar5 * 8)) = puVar2;
  }
  uVar4 = (ulong)(uVar5 * 8);
  if (*(long *)(**(long **)(**(long **)((long)(this->t_).
                                              super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start + uVar4) +
                           uVar4) + uVar4) == 0) {
    puVar2 = (undefined8 *)operator_new(0x18);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    pvVar3 = operator_new(0x1000);
    *puVar2 = pvVar3;
    puVar2[1] = pvVar3;
    puVar2[2] = (long)pvVar3 + 0x1000;
    memset(pvVar3,0,0x1000);
    puVar2[1] = (long)pvVar3 + 0x1000;
    uVar4 = (ulong)(uVar5 * 8);
    *(undefined8 **)
     (**(long **)(**(long **)((long)(this->t_).
                                    super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar4) + uVar4) +
     uVar4) = puVar2;
  }
  uVar4 = (ulong)(uVar5 << 3);
  *(uint64_t *)
   (**(long **)(**(long **)(**(long **)((long)(this->t_).
                                              super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start + uVar4) +
                           uVar4) + uVar4) + uVar4) = padd & 0xffffffffff000;
  this->s_ = this->s_ + 1;
  return;
}

Assistant:

void insert(uint64_t vadd, uint64_t padd) {
    uint16_t p4k = p4_key(vadd);
    uint16_t p3k = p3_key(vadd);
    uint16_t p2k = p2_key(vadd);
    uint16_t p1k = p1_key(vadd);
    if(t_[p4k] == NULL)
      t_[p4k] = new vector< vector< vector<uint64_t>* >* >(p3_size);
    if((*t_[p4k])[p3k] == NULL)
      (*t_[p4k])[p3k] = new vector< vector<uint64_t>* >(p2_size);
    if((*(*t_[p4k])[p3k])[p2k] == NULL)
      (*(*t_[p4k])[p3k])[p2k] = new vector<uint64_t>(p1_size);
    (*(*(*t_[p4k])[p3k])[p2k])[p1k] = pb_add(padd) << 12;
    ++s_;
  }